

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

UInt __thiscall Json::Value::asUInt(Value *this)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  ostringstream oss;
  string local_1a0;
  ostringstream local_180 [376];
  
  uVar3 = (uint)(byte)this->field_0x8;
  switch(this->field_0x8) {
  case 0:
    break;
  case 1:
    bVar2 = isUInt(this);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_180);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_180,"LargestInt out of UInt range",0x1c);
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1a0);
    }
    goto LAB_00114c12;
  case 2:
    bVar2 = isUInt(this);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_180);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_180,"LargestUInt out of UInt range",0x1d);
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1a0);
    }
LAB_00114c12:
    uVar3 = *(uint *)&this->value_;
    break;
  case 3:
    dVar1 = (this->value_).real_;
    if ((dVar1 < 0.0) || (4294967295.0 < dVar1)) {
      std::__cxx11::ostringstream::ostringstream(local_180);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_180,"double out of UInt range",0x18);
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1a0);
    }
    uVar3 = (uint)(long)dVar1;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_180,"Value is not convertible to UInt.",0x21);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
  case 5:
    uVar3 = (uint)(this->value_).bool_;
  }
  return uVar3;
}

Assistant:

Value::UInt Value::asUInt() const {
  switch (type_) {
  case intValue:
    JSON_ASSERT_MESSAGE(isUInt(), "LargestInt out of UInt range");
    return UInt(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isUInt(), "LargestUInt out of UInt range");
    return UInt(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, 0, maxUInt),
                        "double out of UInt range");
    return UInt(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to UInt.");
}